

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O1

int cfft1f_(int *n,int *inc,fft_complex_t *c__,int *lenc,double *wsave,int *lensav,double *work,
           int *lenwrk,int *ier)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  
  *ier = 0;
  iVar1 = *n;
  iVar3 = 1;
  if ((iVar1 + -1) * *inc < *lenc) {
    iVar2 = *lensav;
    dVar4 = log((double)iVar1);
    iVar3 = 2;
    if (((int)(dVar4 / 0.6931471805599453) + iVar1 * 2 + 4 <= iVar2) &&
       (iVar3 = 3, *n * 2 <= *lenwrk)) goto LAB_0010f7d3;
  }
  *ier = iVar3;
LAB_0010f7d3:
  iVar1 = *n;
  if ((long)iVar1 != 1) {
    c1fm1f_(n,inc,c__,work,wsave,wsave + (long)iVar1 * 2,wsave + (long)(iVar1 * 2) + 1);
  }
  return 0;
}

Assistant:

int cfft1f_(int *n, int *inc, complex *c__, int *
	lenc, fft_real_t *wsave, int *lensav, fft_real_t *work, int *lenwrk,
	int *ier)
{

    /* Local variables */
     int iw1;
    extern /* Subroutine */ int c1fm1f_(int *, int *, complex *, fft_real_t
	    *, fft_real_t *, fft_real_t *, fft_real_t *), xerfft_(char *, int *, ftnlen);


    /* Parameter adjustments */
    --c__;
    --wsave;
    --work;

    /* Function Body */
    *ier = 0;

    if (*lenc < *inc * (*n - 1) + 1) {
	*ier = 1;
	////xerfft_("CFFT1F ", &c__4, (ftnlen)7);
    } else if (*lensav < (*n << 1) + (int) (log((fft_real_t) (*n)) / log(2.0))
	    + 4) {
	*ier = 2;
	////xerfft_("CFFT1F ", &c__6, (ftnlen)7);
    } else if (*lenwrk < *n << 1) {
	*ier = 3;
	////xerfft_("CFFT1F ", &c__8, (ftnlen)7);
    }

    if (*n == 1) {
	return 0;
    }

    iw1 = *n + *n + 1;
    c1fm1f_(n, inc, &c__[1], &work[1], &wsave[1], &wsave[iw1], &wsave[iw1 + 1]
	    );
    return 0;
}